

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_visualization.cpp
# Opt level: O0

void __thiscall lumeview::PlainVisualization::refresh(PlainVisualization *this)

{
  bool bVar1;
  element_type *peVar2;
  GrobSet local_33c;
  shared_ptr<lume::Mesh> local_338;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  GrobSet local_2d8;
  GrobSet local_2d4;
  shared_ptr<lume::Mesh> local_2d0;
  allocator local_2b9;
  string local_2b8 [32];
  GrobSet local_298;
  anon_class_1_0_00000001 local_291;
  function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> local_290;
  anon_class_1_0_00000001 local_269;
  function<bool_(const_lume::GrobIndex_&)> local_268;
  GrobSet local_244;
  shared_ptr<lume::Mesh> local_240;
  undefined1 local_230 [8];
  SPMesh bndMesh_1;
  shared_ptr<lume::Mesh> local_218;
  allocator local_201;
  string local_200 [36];
  GrobSet local_1dc;
  shared_ptr<lume::Mesh> local_1d8;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  GrobSet local_178;
  GrobSet local_174;
  shared_ptr<lume::Mesh> local_170;
  allocator local_159;
  string local_158 [36];
  GrobSet local_134;
  shared_ptr<lume::Mesh> local_130;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  anon_class_1_0_00000001 local_c9;
  function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> local_c8;
  anon_class_1_0_00000001 local_a1;
  function<bool_(const_lume::GrobIndex_&)> local_a0;
  GrobSet local_6c;
  shared_ptr<lume::Mesh> local_68;
  undefined1 local_58 [8];
  SPMesh bndMesh;
  undefined1 local_40 [8];
  vec4 bndColor;
  vec4 wireColor;
  vec4 solidColor;
  PlainVisualization *this_local;
  
  Renderer::clear(&this->m_renderer);
  glm::tvec4<float,_(glm::precision)0>::tvec4
            ((tvec4<float,_(glm::precision)0> *)((long)&wireColor.field_0 + 8),1.0,0.843,0.0,1.0);
  glm::tvec4<float,_(glm::precision)0>::tvec4
            ((tvec4<float,_(glm::precision)0> *)((long)&bndColor.field_0 + 8),0.2,0.2,0.2,1.0);
  glm::tvec4<float,_(glm::precision)0>::tvec4
            ((tvec4<float,_(glm::precision)0> *)local_40,1.0,0.2,0.2,1.0);
  peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_mesh);
  lume::GrobSet::GrobSet
            ((GrobSet *)
             ((long)&bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 4),CELLS);
  bVar1 = lume::Mesh::has(peVar2,bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._4_4_);
  if (bVar1) {
    std::shared_ptr<lume::Mesh>::shared_ptr(&local_68,&this->m_mesh);
    lume::GrobSet::GrobSet(&local_6c,CELLS);
    std::function<bool(lume::GrobIndex_const&)>::function<lume::__2,void>
              ((function<bool(lume::GrobIndex_const&)> *)&local_a0,&local_a1);
    std::function<void(lume::GrobIndex_const&,lume::GrobIndex_const&)>::function<lume::__3,void>
              ((function<void(lume::GrobIndex_const&,lume::GrobIndex_const&)> *)&local_c8,&local_c9)
    ;
    lume::CreateRimMesh((lume *)local_58,&local_68,local_6c,&local_a0,&local_c8,(Neighborhoods *)0x0
                       );
    std::function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)>::~function(&local_c8);
    std::function<bool_(const_lume::GrobIndex_&)>::~function(&local_a0);
    std::shared_ptr<lume::Mesh>::~shared_ptr(&local_68);
    peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"normals",&local_f1);
    lume::ComputeFaceVertexNormals3(peVar2,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_58);
    lume::CreateSideGrobs(peVar2,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"solid",&local_119);
    std::shared_ptr<lume::Mesh>::shared_ptr(&local_130,(shared_ptr<lume::Mesh> *)local_58);
    lume::GrobSet::GrobSet(&local_134,FACES);
    Renderer::add_stage(&this->m_renderer,(string *)local_118,&local_130,local_134,FLAT);
    std::shared_ptr<lume::Mesh>::~shared_ptr(&local_130);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    Renderer::stage_set_color(&this->m_renderer,(vec4 *)((long)&wireColor.field_0 + 8),-1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"wire",&local_159);
    std::shared_ptr<lume::Mesh>::shared_ptr(&local_170,(shared_ptr<lume::Mesh> *)local_58);
    lume::GrobSet::GrobSet(&local_174,EDGES);
    Renderer::add_stage(&this->m_renderer,(string *)local_158,&local_170,local_174,FLAT);
    std::shared_ptr<lume::Mesh>::~shared_ptr(&local_170);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    Renderer::stage_set_color(&this->m_renderer,(vec4 *)((long)&bndColor.field_0 + 8),-1);
    std::shared_ptr<lume::Mesh>::~shared_ptr((shared_ptr<lume::Mesh> *)local_58);
  }
  else {
    peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->m_mesh);
    lume::GrobSet::GrobSet(&local_178,FACES);
    bVar1 = lume::Mesh::has(peVar2,local_178);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_mesh);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"normals",&local_199);
      lume::ComputeFaceVertexNormals3(peVar2,(string *)local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_mesh);
      lume::CreateSideGrobs(peVar2,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"solid",&local_1c1);
      std::shared_ptr<lume::Mesh>::shared_ptr(&local_1d8,&this->m_mesh);
      lume::GrobSet::GrobSet(&local_1dc,FACES);
      Renderer::add_stage(&this->m_renderer,(string *)local_1c0,&local_1d8,local_1dc,FLAT);
      std::shared_ptr<lume::Mesh>::~shared_ptr(&local_1d8);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      Renderer::stage_set_color(&this->m_renderer,(vec4 *)((long)&wireColor.field_0 + 8),-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"wire",&local_201);
      std::shared_ptr<lume::Mesh>::shared_ptr(&local_218,&this->m_mesh);
      lume::GrobSet::GrobSet
                ((GrobSet *)
                 ((long)&bndMesh_1.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4),EDGES);
      Renderer::add_stage(&this->m_renderer,(string *)local_200,&local_218,
                          bndMesh_1.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_,FLAT);
      std::shared_ptr<lume::Mesh>::~shared_ptr(&local_218);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      Renderer::stage_set_color(&this->m_renderer,(vec4 *)((long)&bndColor.field_0 + 8),-1);
      std::shared_ptr<lume::Mesh>::shared_ptr(&local_240,&this->m_mesh);
      lume::GrobSet::GrobSet(&local_244,FACES);
      std::function<bool(lume::GrobIndex_const&)>::function<lume::__2,void>
                ((function<bool(lume::GrobIndex_const&)> *)&local_268,&local_269);
      std::function<void(lume::GrobIndex_const&,lume::GrobIndex_const&)>::function<lume::__3,void>
                ((function<void(lume::GrobIndex_const&,lume::GrobIndex_const&)> *)&local_290,
                 &local_291);
      lume::CreateRimMesh((lume *)local_230,&local_240,local_244,&local_268,&local_290,
                          (Neighborhoods *)0x0);
      std::function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)>::~function(&local_290);
      std::function<bool_(const_lume::GrobIndex_&)>::~function(&local_268);
      std::shared_ptr<lume::Mesh>::~shared_ptr(&local_240);
      peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_230);
      lume::GrobSet::GrobSet(&local_298,EDGES);
      bVar1 = lume::Mesh::has(peVar2,local_298);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b8,"bnd",&local_2b9);
        std::shared_ptr<lume::Mesh>::shared_ptr(&local_2d0,(shared_ptr<lume::Mesh> *)local_230);
        lume::GrobSet::GrobSet(&local_2d4,EDGES);
        Renderer::add_stage(&this->m_renderer,(string *)local_2b8,&local_2d0,local_2d4,NONE);
        std::shared_ptr<lume::Mesh>::~shared_ptr(&local_2d0);
        std::__cxx11::string::~string(local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        Renderer::stage_set_color(&this->m_renderer,(vec4 *)local_40,-1);
      }
      std::shared_ptr<lume::Mesh>::~shared_ptr((shared_ptr<lume::Mesh> *)local_230);
    }
    else {
      peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_mesh);
      lume::GrobSet::GrobSet(&local_2d8,EDGES);
      bVar1 = lume::Mesh::has(peVar2,local_2d8);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_mesh);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,"normals",&local_2f9);
        lume::ComputeFaceVertexNormals3(peVar2,(string *)local_2f8);
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_320,"wire",&local_321);
        std::shared_ptr<lume::Mesh>::shared_ptr(&local_338,&this->m_mesh);
        lume::GrobSet::GrobSet(&local_33c,EDGES);
        Renderer::add_stage(&this->m_renderer,(string *)local_320,&local_338,local_33c,NONE);
        std::shared_ptr<lume::Mesh>::~shared_ptr(&local_338);
        std::__cxx11::string::~string(local_320);
        std::allocator<char>::~allocator((allocator<char> *)&local_321);
        Renderer::stage_set_color(&this->m_renderer,(vec4 *)((long)&bndColor.field_0 + 8),-1);
      }
    }
  }
  return;
}

Assistant:

void PlainVisualization::
refresh ()
{
	m_renderer.clear();

	const glm::vec4 solidColor (1.0f, 0.843f, 0.f, 1.0f);
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);
	const glm::vec4 bndColor (1.0f, 0.2f, 0.2f, 1.0f);

	if (m_mesh->has (CELLS)) {
		auto bndMesh = CreateRimMesh (m_mesh, CELLS);
		ComputeFaceVertexNormals3 (*bndMesh, "normals");
		CreateSideGrobs (*bndMesh, 1);
		m_renderer.add_stage ("solid", bndMesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", bndMesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
	}
	else if (m_mesh->has (FACES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		CreateSideGrobs (*m_mesh, 1);
		m_renderer.add_stage ("solid", m_mesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", m_mesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
		auto bndMesh = CreateRimMesh (m_mesh, FACES);
		if (bndMesh->has (EDGES)) {
			m_renderer.add_stage ("bnd", bndMesh, EDGES, NONE);
			m_renderer.stage_set_color (bndColor);
		}
	}
	else if (m_mesh->has (EDGES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		m_renderer.add_stage ("wire", m_mesh, EDGES, NONE);
		m_renderer.stage_set_color (wireColor);
	}
}